

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

UGroupingStrategy icu_63::number::impl::stem_to_object::groupingStrategy(StemEnum stem)

{
  UGroupingStrategy UVar1;
  
  UVar1 = UNUM_GROUPING_COUNT;
  if (stem - 0x14 < UNUM_GROUPING_COUNT) {
    UVar1 = stem - 0x14;
  }
  return UVar1;
}

Assistant:

UGroupingStrategy stem_to_object::groupingStrategy(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_GROUP_OFF:
            return UNUM_GROUPING_OFF;
        case STEM_GROUP_MIN2:
            return UNUM_GROUPING_MIN2;
        case STEM_GROUP_AUTO:
            return UNUM_GROUPING_AUTO;
        case STEM_GROUP_ON_ALIGNED:
            return UNUM_GROUPING_ON_ALIGNED;
        case STEM_GROUP_THOUSANDS:
            return UNUM_GROUPING_THOUSANDS;
        default:
            return UNUM_GROUPING_COUNT; // for objects, throw; for enums, return COUNT
    }
}